

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O3

void __thiscall
MemoryLeakDetector::deallocAllMemoryInCurrentAllocationStage(MemoryLeakDetector *this)

{
  void *memory;
  TestMemoryAllocator *allocator;
  MemoryLeakDetectorNode *leak;
  int i;
  long lVar1;
  MemoryLeakDetectorNode *cur;
  
  lVar1 = 0;
  do {
    for (leak = (this->memoryTable_).table_[lVar1].head_; leak != (MemoryLeakDetectorNode *)0x0;
        leak = *(MemoryLeakDetectorNode **)(leak + 0x38)) {
      if (leak[0x34] == (MemoryLeakDetectorNode)this->current_allocation_stage_) {
        do {
          memory = *(void **)(leak + 0x10);
          allocator = *(TestMemoryAllocator **)(leak + 0x28);
          leak = MemoryLeakDetectorTable::getNextLeakForAllocationStage
                           (&this->memoryTable_,leak,this->current_allocation_stage_);
          deallocMemory(this,allocator,memory,
                        "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/build_O3/CMake/cpputest/cpputest-src/src/CppUTest/MemoryLeakDetector.cpp"
                        ,0x2bf,false);
        } while (leak != (MemoryLeakDetectorNode *)0x0);
        return;
      }
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x49);
  return;
}

Assistant:

void MemoryLeakDetector::deallocAllMemoryInCurrentAllocationStage()
{
    char* memory = NULLPTR;
    MemoryLeakDetectorNode* node = memoryTable_.getFirstLeakForAllocationStage(current_allocation_stage_);
    while (node) {
        memory = node->memory_;
        TestMemoryAllocator* allocator = node->allocator_;
        node = memoryTable_.getNextLeakForAllocationStage(node, current_allocation_stage_);
        deallocMemory(allocator, memory, __FILE__, __LINE__);
    }
}